

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

namespace_t __thiscall cs::instance_type::source_import(instance_type *this,string *path)

{
  bool bVar1;
  size_t sVar2;
  element_type *args;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  instance_type *in_RSI;
  element_type *in_RDI;
  namespace_t nVar4;
  string *in_stack_000000f8;
  context_t rt;
  namespace_t *module;
  context_t *in_stack_000003d8;
  shared_ptr<cs::context_type> *in_stack_fffffffffffffe98;
  shared_ptr<cs::context_type> *in_stack_fffffffffffffea0;
  __shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
  *in_stack_fffffffffffffeb0;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
  *this_01;
  compiler_type *in_stack_fffffffffffffeb8;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
  *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  domain_manager *in_stack_ffffffffffffff58;
  instance_type *this_02;
  
  this_02 = in_RSI;
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x127f95);
  std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x127f9d);
  sVar2 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
          ::count<std::__cxx11::string>
                    (in_stack_fffffffffffffec0,
                     (key_arg<std::__cxx11::basic_string<char>_> *)in_stack_fffffffffffffeb8);
  if (sVar2 == 0) {
    bVar1 = cs_impl::file_system::is_exe((string *)in_stack_fffffffffffffea8);
    if (bVar1) {
      std::make_shared<cs::extension,std::__cxx11::string_const&>(in_stack_fffffffffffffec8);
      std::shared_ptr<cs::name_space>::shared_ptr<cs::extension,void>
                ((shared_ptr<cs::name_space> *)in_stack_fffffffffffffea0,
                 (shared_ptr<cs::extension> *)in_stack_fffffffffffffe98);
      std::shared_ptr<cs::extension>::~shared_ptr((shared_ptr<cs::extension> *)0x128047);
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x128058);
      std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x128060);
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
      ::
      emplace<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::shared_ptr<cs::name_space>_&,_0>
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 (shared_ptr<cs::name_space> *)in_stack_fffffffffffffea0);
      _Var3._M_pi = extraout_RDX_00;
    }
    else {
      create_subcontext(in_stack_000003d8);
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1280f1);
      std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1280f9);
      std::shared_ptr<cs::context_type>::shared_ptr
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      compiler_type::swap_context(in_stack_fffffffffffffeb8,(context_t *)in_stack_fffffffffffffeb0);
      std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x12813b);
      std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x128148);
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x128155);
      std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x128161);
      compile((instance_type *)
              rt.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
              in_stack_000000f8);
      this_00 = (__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                &in_RSI->context;
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x12828f);
      args = std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x128297);
      this_01 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                 *)&stack0xffffffffffffff38;
      std::shared_ptr<cs::context_type>::shared_ptr
                ((shared_ptr<cs::context_type> *)this_00,in_stack_fffffffffffffe98);
      compiler_type::swap_context(in_stack_fffffffffffffeb8,(context_t *)this_01);
      std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x1282d9);
      std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x1282e6);
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1282f3);
      std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1282ff);
      interpret(this_02);
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x12831e);
      std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x12832a);
      domain_manager::get_namespace(in_stack_ffffffffffffff58);
      std::__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                (this_00);
      std::make_shared<cs::name_space,cs::name_space&>((name_space *)in_stack_fffffffffffffec8);
      std::shared_ptr<cs::name_space>::~shared_ptr((shared_ptr<cs::name_space> *)0x128369);
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x12837a);
      std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x128382);
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
      ::
      emplace<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::shared_ptr<cs::name_space>_&,_0>
                (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
                 (shared_ptr<cs::name_space> *)this_00);
      std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x12844d);
      _Var3._M_pi = extraout_RDX_01;
    }
  }
  else {
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x127fc8);
    std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x127fd0);
    phmap::priv::
    raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
    ::
    operator[]<std::__cxx11::string,phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>>
              ((raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                *)in_stack_fffffffffffffeb0,
               (key_arg<std::__cxx11::basic_string<char>_> *)in_stack_fffffffffffffea8);
    std::shared_ptr<cs::name_space>::shared_ptr
              ((shared_ptr<cs::name_space> *)in_stack_fffffffffffffea0,
               (shared_ptr<cs::name_space> *)in_stack_fffffffffffffe98);
    _Var3._M_pi = extraout_RDX;
  }
  nVar4.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  nVar4.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (namespace_t)nVar4.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

namespace_t instance_type::source_import(const std::string &path)
	{
		if (context->compiler->modules.count(path) > 0)
			return context->compiler->modules[path];
		if (cs_impl::file_system::is_exe(path)) {
			// is extension file
			namespace_t module = std::make_shared<extension>(path);
			context->compiler->modules.emplace(path, module);
			return module;
		}
		else {
			// is package file
			context_t rt = create_subcontext(context);
			rt->compiler->swap_context(rt);
			try {
				rt->instance->compile(path);
			}
			catch (...) {
				context->compiler->swap_context(context);
				throw;
			}
			context->compiler->swap_context(context);
			rt->instance->interpret();
			namespace_t module = std::make_shared<name_space>(*rt->instance->storage.get_namespace());
			context->compiler->modules.emplace(path, module);
			return module;
		}
	}